

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int create_hashtable(hash_table_t *table,size_t initial_size,hash_func_t hashfunc,hash_cmp_t keycmp)

{
  undefined1 auVar1 [16];
  int iVar2;
  void *__s;
  ulong in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  int entries_per_page;
  hash_entry_t *newtable;
  ulong local_18;
  int local_4;
  
  iVar2 = getpagesize();
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar2;
  iVar2 = SUB164(auVar1 / ZEXT816(0x30),0);
  local_18 = in_RSI;
  if (in_RSI % (ulong)(long)iVar2 != 0) {
    local_18 = ((long)iVar2 - in_RSI % (ulong)(long)iVar2) + in_RSI;
  }
  __s = malloc(local_18 * 0x30);
  if (__s == (void *)0x0) {
    local_4 = -1;
  }
  else {
    memset(__s,0,local_18 * 0x30);
    *in_RDI = local_18;
    in_RDI[1] = 0;
    in_RDI[2] = in_RDX;
    in_RDI[3] = in_RCX;
    in_RDI[4] = (ulong)__s;
    in_RDI[5] = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int create_hashtable(hash_table_t *table, size_t initial_size, hash_func_t hashfunc, 
                     hash_cmp_t keycmp)
{
   hash_entry_t *newtable;
   int entries_per_page;

   entries_per_page = gotcha_getpagesize() / sizeof(hash_entry_t);
   if (initial_size % entries_per_page)
      initial_size += entries_per_page - (initial_size % entries_per_page);

   newtable = (hash_entry_t *) gotcha_malloc(initial_size * sizeof(hash_entry_t));
   if (!newtable)
      return -1;
   gotcha_memset(newtable, 0, initial_size * sizeof(hash_entry_t));

   table->table_size = initial_size;
   table->entry_count = 0;
   table->hashfunc = hashfunc;
   table->keycmp = keycmp;
   table->table = newtable;
   table->head = NULL;
   
   return 0;
}